

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O3

int Lodtalk::Object::stAt(InterpreterProxy *interpreter)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Oop *oopData;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar4;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  size_t sVar5;
  uint8_t *puVar6;
  ulong uVar7;
  Oop OVar8;
  long lVar9;
  Oop self;
  anon_union_8_4_0eb573b0_for_Oop_0 local_38;
  undefined4 extraout_var_01;
  
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar1) != 1) {
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
    return iVar1;
  }
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
  (*interpreter->_vptr_InterpreterProxy[1])(interpreter,CONCAT44(extraout_var_00,iVar1));
  iVar1 = stSize(interpreter);
  if (iVar1 == 0) {
    aVar4._0_4_ = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
    aVar4.uintValue._4_4_ = extraout_var_01;
    local_38 = aVar4;
    uVar2 = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
    uVar3 = (*interpreter->_vptr_InterpreterProxy[6])(interpreter);
    if (((uVar3 & 1) == 0) || ((uVar2 & 1) == 0)) {
      __assert_fail("isSmallInteger()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                    ,0x200,"SmallIntegerValue Lodtalk::Oop::decodeSmallInteger() const");
    }
    lVar9 = CONCAT44(extraout_var_02,uVar2) >> 1;
    if ((lVar9 < 1) || (CONCAT44(extraout_var_03,uVar3) >> 1 < lVar9 + -1)) {
      iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
    }
    else {
      iVar1 = (**interpreter->_vptr_InterpreterProxy)(interpreter);
      if ((aVar4._0_4_ & 7) == 0) {
        sVar5 = Oop::getFixedSlotCount
                          ((Oop *)&local_38,(VMContext *)CONCAT44(extraout_var_04,iVar1));
        puVar6 = aVar4.pointer + sVar5 * 8 + 8;
        aVar4 = local_38;
      }
      else {
        puVar6 = (uint8_t *)0x0;
      }
      uVar2 = (uint)((ulong)*(undefined8 *)aVar4.pointer >> 0x23) & 0x1f;
      if (uVar2 < 9) {
        lVar9 = *(long *)(puVar6 + lVar9 * 8 + -8);
      }
      else {
        if (uVar2 < 0x10) {
          if (uVar2 < 0xc) {
            if (uVar2 == 9) {
              OVar8 = VMContext::positiveInt64ObjectFor
                                ((VMContext *)CONCAT44(extraout_var_04,iVar1),
                                 *(uint64_t *)(puVar6 + lVar9 * 8 + -8));
              iVar1 = (*interpreter->_vptr_InterpreterProxy[0x17])(interpreter,OVar8.field_0);
              return iVar1;
            }
            uVar7 = (ulong)*(uint *)(puVar6 + lVar9 * 4 + -4);
          }
          else {
            uVar7 = (ulong)*(ushort *)(puVar6 + lVar9 * 2 + -2);
          }
        }
        else {
          uVar7 = (ulong)puVar6[lVar9 + -1];
        }
        lVar9 = uVar7 * 2 + 1;
      }
      iVar1 = (*interpreter->_vptr_InterpreterProxy[0x17])(interpreter,lVar9);
    }
  }
  return iVar1;
}

Assistant:

int Object::stAt(InterpreterProxy *interpreter)
{
    if(interpreter->getArgumentCount() != 1)
        return interpreter->primitiveFailed();

    interpreter->pushOop(interpreter->getReceiver());
    auto error = stSize(interpreter);
    if(error != 0)
        return error;

    Oop self = interpreter->getReceiver();
    Oop indexOop = interpreter->getTemporary(0);
    auto size = interpreter->popOop().decodeSmallInteger();
	auto index = indexOop.decodeSmallInteger() - 1;
	if(index > size || index < 0)
		return interpreter->primitiveFailed();

    // Get the element.
    auto context = interpreter->getContext();
    auto firstIndexableField = self.getFirstIndexableFieldPointer(context);
    auto format = self.header->objectFormat;
    if(format < OF_INDEXABLE_64)
    {
        auto oopData = reinterpret_cast<Oop*> (firstIndexableField);
        return interpreter->returnOop(oopData[index]);
    }

    if(format >= OF_INDEXABLE_8)
    {
        auto data = reinterpret_cast<uint8_t*> (firstIndexableField);
        return interpreter->returnOop(Oop::encodeSmallInteger(data[index]));
    }

    if(format >= OF_INDEXABLE_16)
    {
        auto data = reinterpret_cast<uint16_t*> (firstIndexableField);
        return interpreter->returnOop(Oop::encodeSmallInteger(data[index]));
    }

    if(format >= OF_INDEXABLE_32)
    {
        auto data = reinterpret_cast<uint32_t*> (firstIndexableField);
#ifdef OBJECT_MODEL_SPUR_64
        return interpreter->returnOop(Oop::encodeSmallInteger(data[index]));
#else
        return interpreter->returnOop(context->positiveInt32ObjectFor(data[index]));
#endif
    }

    if(format == OF_INDEXABLE_64)
    {
        auto data = reinterpret_cast<uint64_t*> (firstIndexableField);
        return interpreter->returnOop(context->positiveInt64ObjectFor(data[index]));
    }

    // Should not reach here.
    return interpreter->primitiveFailed();
}